

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_texture2d * rf_load_texture_from_image_with_mipmaps(rf_mipmaps_image image)

{
  uint uVar1;
  rf_texture2d *in_RDI;
  void *in_stack_00000008;
  
  memset(in_RDI,0,0x18);
  if (((undefined1  [32])image & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) {
    rf_log_impl(4,0x1b2fd8);
  }
  else {
    uVar1 = rf_gfx_load_texture(in_stack_00000008,image.field_0._0_4_,image.field_0._4_4_,
                                image.field_0.image.width,image.field_0.image.format);
    in_RDI->id = uVar1;
    if (in_RDI->id != 0) {
      in_RDI->width = image.field_0._0_4_;
      in_RDI->height = image.field_0._4_4_;
      in_RDI->format = image.field_0.image.width;
      in_RDI->valid = true;
    }
  }
  return in_RDI;
}

Assistant:

RF_API rf_texture2d rf_load_texture_from_image_with_mipmaps(rf_mipmaps_image image)
{
    rf_texture2d result = {0};

    if (image.valid)
    {
        result.id = rf_gfx_load_texture(image.data, image.width, image.height, image.format, image.mipmaps);

        if (result.id != 0)
        {
            result.width  = image.width;
            result.height = image.height;
            result.format = image.format;
            result.valid  = true;
        }
    }
    else RF_LOG(RF_LOG_TYPE_WARNING, "rf_texture could not be loaded from rf_image");

    return result;
}